

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkSopEsopCover(Abc_Ntk_t *pNtk,int nFaninMax,int nCubesMax,int fUseEsop,int fUseSop,
                   int fUseInvs,int fVerbose)

{
  int iVar1;
  Cov_Man_t *p_00;
  Cov_Man_t *p;
  Abc_Ntk_t *pNtkNew;
  int fUseInvs_local;
  int fUseSop_local;
  int fUseEsop_local;
  int nCubesMax_local;
  int nFaninMax_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    p_00 = Cov_ManAlloc(pNtk,nFaninMax,nCubesMax);
    p_00->fUseEsop = fUseEsop;
    p_00->fUseSop = fUseSop;
    pNtk->pManCut = p_00;
    Abc_NtkCovCovers(p_00,pNtk,fVerbose);
    pNtk_local = Abc_NtkCovDeriveRegular(p_00,pNtk);
    Cov_ManFree(p_00);
    pNtk->pManCut = (void *)0x0;
    if ((pNtk_local != (Abc_Ntk_t *)0x0) && (iVar1 = Abc_NtkCheck(pNtk_local), iVar1 == 0)) {
      printf("Abc_NtkCov: The network check has failed.\n");
      Abc_NtkDelete(pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covCore.c"
                ,0x41,"Abc_Ntk_t *Abc_NtkSopEsopCover(Abc_Ntk_t *, int, int, int, int, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSopEsopCover( Abc_Ntk_t * pNtk, int nFaninMax, int nCubesMax, int fUseEsop, int fUseSop, int fUseInvs, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Cov_Man_t * p;

    assert( Abc_NtkIsStrash(pNtk) );

    // create the manager
    p = Cov_ManAlloc( pNtk, nFaninMax, nCubesMax );
    p->fUseEsop = fUseEsop;
    p->fUseSop  = fUseSop;
    pNtk->pManCut = p;

    // perform mapping
    Abc_NtkCovCovers( p, pNtk, fVerbose );

    // derive the final network
//    if ( fUseInvs )
//        pNtkNew = Abc_NtkCovDeriveClean( p, pNtk );
//      else
//       pNtkNew = Abc_NtkCovDerive( p, pNtk );
//    pNtkNew = NULL;
    pNtkNew = Abc_NtkCovDeriveRegular( p, pNtk );

    Cov_ManFree( p );
    pNtk->pManCut = NULL;

    // make sure that everything is okay
    if ( pNtkNew && !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCov: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}